

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringComparison.h
# Opt level: O3

int Assimp::ASSIMP_stricmp(string *a,string *b)

{
  char *__s1;
  char *__s2;
  int iVar1;
  
  iVar1 = (int)b->_M_string_length - (int)a->_M_string_length;
  if (iVar1 != 0) {
    return iVar1;
  }
  __s1 = (a->_M_dataplus)._M_p;
  if (__s1 != (char *)0x0) {
    __s2 = (b->_M_dataplus)._M_p;
    if (__s2 != (char *)0x0) {
      iVar1 = strcasecmp(__s1,__s2);
      return iVar1;
    }
    __assert_fail("__null != s2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                  ,0x8b,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
  }
  __assert_fail("__null != s1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                ,0x8a,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
}

Assistant:

AI_FORCE_INLINE
int ASSIMP_stricmp(const std::string& a, const std::string& b) {
    int i = (int)b.length()-(int)a.length();
    return (i ? i : ASSIMP_stricmp(a.c_str(),b.c_str()));
}